

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

TCGv_i32 op_addr_ri_pre(DisasContext_conflict1 *s,arg_ldst_ri *a)

{
  TCGContext_conflict1 *s_00;
  int32_t arg2;
  TCGTemp *ts;
  TCGv_i32 pTVar1;
  TCGTemp *local_38;
  TCGTemp *local_30;
  
  arg2 = -a->imm;
  if (a->u != 0) {
    arg2 = a->imm;
  }
  if (((s->v8m_stackcheck == true) && (a->rn == 0xd)) && (a->w != 0)) {
    s_00 = s->uc->tcg_ctx;
    if (a->u == 0) {
      ts = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I32,false);
      tcg_gen_addi_i32_aarch64(s_00,(TCGv_i32)((long)ts - (long)s_00),s_00->cpu_R[0xd],arg2);
      local_38 = (TCGTemp *)(s_00->cpu_env + (long)s_00);
      local_30 = ts;
      tcg_gen_callN_aarch64(s_00,helper_v8m_stackcheck_aarch64,(TCGTemp *)0x0,2,&local_38);
      tcg_temp_free_internal_aarch64(s_00,ts);
    }
    else {
      local_38 = (TCGTemp *)(s_00->cpu_env + (long)s_00);
      local_30 = (TCGTemp *)(s_00->cpu_R[0xd] + (long)s_00);
      tcg_gen_callN_aarch64(s_00,helper_v8m_stackcheck_aarch64,(TCGTemp *)0x0,2,&local_38);
    }
  }
  if (a->p == 0) {
    arg2 = 0;
  }
  pTVar1 = add_reg_for_lit(s,a->rn,arg2);
  return pTVar1;
}

Assistant:

static TCGv_i32 op_addr_ri_pre(DisasContext *s, arg_ldst_ri *a)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    int ofs = a->imm;

    if (!a->u) {
        ofs = -ofs;
    }

    if (s->v8m_stackcheck && a->rn == 13 && a->w) {
        /*
         * Stackcheck. Here we know 'addr' is the current SP;
         * U is set if we're moving SP up, else down. It is
         * UNKNOWN whether the limit check triggers when SP starts
         * below the limit and ends up above it; we chose to do so.
         */
        if (!a->u) {
            TCGv_i32 newsp = tcg_temp_new_i32(tcg_ctx);
            tcg_gen_addi_i32(tcg_ctx, newsp, tcg_ctx->cpu_R[13], ofs);
            gen_helper_v8m_stackcheck(tcg_ctx, tcg_ctx->cpu_env, newsp);
            tcg_temp_free_i32(tcg_ctx, newsp);
        } else {
            gen_helper_v8m_stackcheck(tcg_ctx, tcg_ctx->cpu_env, tcg_ctx->cpu_R[13]);
        }
    }

    return add_reg_for_lit(s, a->rn, a->p ? ofs : 0);
}